

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validationinterface.cpp
# Opt level: O3

void __thiscall
ValidationSignals::BlockChecked(ValidationSignals *this,CBlock *block,BlockValidationState *state)

{
  _List_node_base *p_Var1;
  _Head_base<0UL,_ValidationSignalsImpl_*,_false> _Var2;
  _List_node_base *p_Var3;
  bool bVar4;
  Logger *this_00;
  iterator __position;
  iterator __ret;
  _List_node_base *this_01;
  long in_FS_OFFSET;
  string_view source_file;
  string_view logging_function;
  string local_d8;
  UniqueLock<AnnotatedMixin<std::mutex>_> lock;
  reverse_lock local_98;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = LogInstance();
  bVar4 = BCLog::Logger::WillLogCategoryLevel(this_00,VALIDATION,Debug);
  if (bVar4) {
    CBlockHeader::GetHash((uint256 *)&lock,&block->super_CBlockHeader);
    base_blob<256u>::ToString_abi_cxx11_((string *)&local_98,(uint256 *)&lock);
    ValidationState<BlockValidationResult>::ToString_abi_cxx11_
              (&local_d8,&state->super_ValidationState<BlockValidationResult>);
    source_file._M_str =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validationinterface.cpp"
    ;
    source_file._M_len = 0x67;
    logging_function._M_str = "BlockChecked";
    logging_function._M_len = 0xc;
    LogPrintFormatInternal<char[13],std::__cxx11::string,std::__cxx11::string>
              (logging_function,source_file,0xfb,VALIDATION,Debug,
               (ConstevalFormatString<3U>)0xfb6ba5,(char (*) [13])"BlockChecked",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_98,
               &local_d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
      operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
    }
    if (local_98.lock !=
        (UniqueLock<AnnotatedMixin<std::mutex>_> *)&local_98.templock.super_unique_lock._M_owns) {
      operator_delete(local_98.lock,local_98.templock.super_unique_lock._8_8_ + 1);
    }
  }
  _Var2._M_head_impl =
       (this->m_internals)._M_t.
       super___uniq_ptr_impl<ValidationSignalsImpl,_std::default_delete<ValidationSignalsImpl>_>.
       _M_t.
       super__Tuple_impl<0UL,_ValidationSignalsImpl_*,_std::default_delete<ValidationSignalsImpl>_>.
       super__Head_base<0UL,_ValidationSignalsImpl_*,_false>._M_head_impl;
  lock.super_unique_lock._M_owns = false;
  lock.super_unique_lock._M_device = (mutex_type *)_Var2._M_head_impl;
  std::unique_lock<std::mutex>::lock(&lock.super_unique_lock);
  __position._M_node =
       *(_List_node_base **)
        &((_Var2._M_head_impl)->m_list).
         super__List_base<ValidationSignalsImpl::ListEntry,_std::allocator<ValidationSignalsImpl::ListEntry>_>
  ;
  this_01 = (_List_node_base *)&(_Var2._M_head_impl)->m_list;
  if (__position._M_node != this_01) {
    do {
      *(int *)&__position._M_node[2]._M_next = *(int *)&__position._M_node[2]._M_next + 1;
      UniqueLock<AnnotatedMixin<std::mutex>_>::reverse_lock::reverse_lock
                (&local_98,&lock,"lock",
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validationinterface.cpp"
                 ,0x57);
      (*(code *)(__position._M_node[1]._M_next)->_M_next[4]._M_next)
                (__position._M_node[1]._M_next,block,state);
      UniqueLock<AnnotatedMixin<std::mutex>_>::reverse_lock::~reverse_lock(&local_98);
      p_Var1 = __position._M_node + 2;
      *(int *)&p_Var1->_M_next = *(int *)&p_Var1->_M_next + -1;
      p_Var3 = (__position._M_node)->_M_next;
      if (*(int *)&p_Var1->_M_next == 0) {
        std::__cxx11::
        list<ValidationSignalsImpl::ListEntry,_std::allocator<ValidationSignalsImpl::ListEntry>_>::
        _M_erase((list<ValidationSignalsImpl::ListEntry,_std::allocator<ValidationSignalsImpl::ListEntry>_>
                  *)this_01,__position);
      }
      __position._M_node = p_Var3;
    } while (p_Var3 != this_01);
  }
  std::unique_lock<std::mutex>::~unique_lock(&lock.super_unique_lock);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void ValidationSignals::BlockChecked(const CBlock& block, const BlockValidationState& state) {
    LOG_EVENT("%s: block hash=%s state=%s", __func__,
              block.GetHash().ToString(), state.ToString());
    m_internals->Iterate([&](CValidationInterface& callbacks) { callbacks.BlockChecked(block, state); });
}